

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

PackageMempoolAcceptResult * __thiscall
anon_unknown.dwarf_12c12b5::MemPoolAccept::AcceptSubPackage
          (PackageMempoolAcceptResult *__return_storage_ptr__,MemPoolAccept *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *subpackage,ATMPArgs *args)

{
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_00;
  CTransactionRef *ptx;
  element_type *peVar1;
  PackageValidationState state;
  undefined1 auVar2 [8];
  long in_FS_OFFSET;
  initializer_list<std::pair<const_uint256,_MempoolAcceptResult>_> __l;
  size_type __dnew;
  PackageValidationState package_state_wrapped;
  MempoolAcceptResult single_res;
  undefined1 in_stack_fffffffffffffcd8 [16];
  CChainParams *pCVar3;
  int64_t iVar4;
  bool bVar5;
  undefined7 in_stack_fffffffffffffcf9;
  vector<COutPoint,_std::allocator<COutPoint>_> *pvVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined3 in_stack_fffffffffffffd0d;
  _Storage<CFeeRate,_true> _Var9;
  undefined8 uVar10;
  undefined1 local_2d8 [8];
  size_type sStack_2d0;
  undefined1 local_2c8 [16];
  undefined1 auStack_2b8 [8];
  _Base_ptr local_2b0;
  _Alloc_hider _Stack_2a8;
  undefined8 local_2a0;
  undefined1 auStack_298 [16];
  _Alloc_hider local_288;
  size_type sStack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_268 [3];
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_220;
  bool local_208;
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_1d8;
  undefined1 local_1a8 [8];
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  long *local_180 [2];
  long local_170 [2];
  pointer local_160;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_118 [2];
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_c8 [3];
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_80;
  bool local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ptx = (subpackage->
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(subpackage->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ptx) < 0x11) {
    pCVar3 = args->m_chainparams;
    iVar4 = args->m_accept_time;
    pvVar6 = args->m_coins_to_uncache;
    bVar7 = args->m_test_accept;
    _Var9 = (args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._M_payload;
    uVar10._0_1_ = (args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload
                   .super__Optional_payload_base<CFeeRate>._M_engaged;
    uVar10._1_7_ = *(undefined7 *)
                    &(args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>.
                     _M_payload.super__Optional_payload_base<CFeeRate>.field_0x9;
    bVar5 = false;
    uVar8._0_1_ = true;
    uVar8._1_1_ = true;
    uVar8._2_1_ = true;
    uVar8._3_1_ = false;
    AcceptSingleTransaction
              ((MempoolAcceptResult *)local_118,this,ptx,(ATMPArgs *)&stack0xfffffffffffffce8);
    local_160 = (pointer)0x0;
    local_150 = 0;
    local_148._M_local_buf[0] = '\0';
    local_138._M_p = (pointer)&local_128;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_158._M_p = (pointer)&local_148;
    if ((ResultType)local_118[0] != VALID) {
      local_1a8 = (undefined1  [8])0x12;
      local_2d8 = (undefined1  [8])local_2c8;
      local_2d8 = (undefined1  [8])
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2d8,(size_type *)local_1a8,0);
      local_2c8._0_8_ = local_1a8;
      builtin_strncpy((char *)local_2d8,"transaction failed",0x12);
      sStack_2d0 = (size_type)local_1a8;
      *(char *)((long)local_2d8 + (long)local_1a8) = '\0';
      local_1a0 = (char *)0x0;
      local_198._M_local_buf[0] = '\0';
      local_1a8 = (undefined1  [8])&local_198;
      ValidationState<PackageValidationResult>::Invalid
                ((ValidationState<PackageValidationResult> *)&local_160,PCKG_TX,(string *)local_2d8,
                 (string *)local_1a8);
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8,
                        CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) +
                        1);
      }
      if (local_2d8 != (undefined1  [8])local_2c8) {
        operator_delete((void *)local_2d8,local_2c8._0_8_ + 1);
      }
    }
    local_1a8 = (undefined1  [8])local_160;
    local_1a0 = local_198._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,local_158._M_p,local_158._M_p + local_150);
    local_180[0] = local_170;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_180,local_138._M_p,local_138._M_p + local_130);
    peVar1 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_2d8 = *(undefined1 (*) [8])
                 (peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    sStack_2d0 = *(size_type *)
                  ((long)(peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  8);
    local_2c8._0_8_ =
         *(undefined8 *)
          ((long)(peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    local_2c8._8_8_ =
         *(undefined8 *)
          ((long)(peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    MempoolAcceptResult::MempoolAcceptResult
              ((MempoolAcceptResult *)auStack_2b8,(MempoolAcceptResult *)local_118);
    __l._M_len = 1;
    __l._M_array = (iterator)local_2d8;
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           *)&local_1d8,__l,(less<uint256> *)&stack0xfffffffffffffce7,
          (allocator_type *)&stack0xfffffffffffffce6);
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
         (size_type)pCVar3;
    state.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffffcd8._0_4_;
    state.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffffcd8._4_4_;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)in_stack_fffffffffffffcd8._8_8_;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity = iVar4;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf[8] =
         bVar5;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
         in_stack_fffffffffffffcf9;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)pvVar6;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._0_1_ =
         bVar7;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._1_1_ =
         SUB41(uVar8,0);
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._2_1_ =
         SUB41(uVar8,1);
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._3_1_ =
         SUB41(uVar8,2);
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._4_1_ =
         SUB41(uVar8,3);
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._5_3_ =
         in_stack_fffffffffffffd0d;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_allocated_capacity = (size_type)_Var9;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ = uVar10;
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              (__return_storage_ptr__,state,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)local_1a8);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~_Rb_tree(&local_1d8);
    if (local_208 == true) {
      local_208 = false;
      if (local_220._M_value.
          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_220._M_value.
                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_220._M_value.
                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - local_220._0_8_);
      }
    }
    std::__cxx11::
    _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::_M_clear(local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_p != &local_278) {
      operator_delete(local_288._M_p,local_278._M_allocated_capacity + 1);
    }
    if (_Stack_2a8._M_p != auStack_298) {
      operator_delete(_Stack_2a8._M_p,auStack_298._0_8_ + 1);
    }
    if (local_180[0] != local_170) {
      operator_delete(local_180[0],local_170[0] + 1);
    }
    if (local_1a0 != local_198._M_local_buf + 8) {
      operator_delete(local_1a0,local_198._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != &local_128) {
      operator_delete(local_138._M_p,
                      CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_p != &local_148) {
      operator_delete(local_158._M_p,
                      CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1)
      ;
    }
    if (local_68 == true) {
      local_68 = false;
      if (local_80._M_value.
          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80._M_value.
                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_80._M_value.
                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - local_80._0_8_);
      }
    }
    std::__cxx11::
    _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::_M_clear(&(((MempoolAcceptResult *)local_118)->m_replaced_transactions).
                super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&((MempoolAcceptResult *)local_118)->m_state + 0x38U)) {
      operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&((MempoolAcceptResult *)local_118)->m_state + 0x18U)) {
      operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
    }
  }
  else {
    AcceptMultipleTransactions(__return_storage_ptr__,this,subpackage,args);
  }
  local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffffffffff00;
  local_2d8 = (undefined1  [8])0x0;
  sStack_2d0 = 0;
  local_2b0 = (_Base_ptr)0x0;
  local_2c8._8_8_ = 0;
  auStack_2b8 = (undefined1  [8])0x0;
  this_00 = (_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)(auStack_298 + 8);
  auStack_298._0_8_ = 0;
  sStack_280 = 0;
  local_278._M_allocated_capacity = 0;
  local_278._8_8_ = 0;
  (this->m_subpackage).m_rbf = false;
  (this->m_subpackage).m_total_modified_fees = 0;
  (this->m_subpackage).m_total_vsize = 0;
  _Stack_2a8._M_p = (pointer)auStack_2b8;
  local_2a0 = (__node_base *)auStack_2b8;
  auStack_298._8_8_ = this_00;
  local_288._M_p = (pointer)this_00;
  std::_Rb_tree<$270907ca$>::clear(&(this->m_subpackage).m_all_conflicts._M_t);
  if (local_2b0 != (_Base_ptr)0x0) {
    (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         auStack_2b8._0_4_;
    (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_2b0;
    *(float *)&(this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left = _Stack_2a8._M_p._0_4_;
    *(undefined4 *)
     ((long)&(this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left + 4) = _Stack_2a8._M_p._4_4_;
    *(undefined4 *)
     &(this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (undefined4)local_2a0;
    *(undefined4 *)
     ((long)&(this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_right + 4) = local_2a0._4_4_;
    local_2b0->_M_parent =
         &(this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header;
    (this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count =
         auStack_298._0_8_;
    local_2b0 = (_Base_ptr)0x0;
    auStack_298._0_8_ = 0;
    _Stack_2a8._M_p = (pointer)auStack_2b8;
    local_2a0 = (__node_base *)auStack_2b8;
  }
  std::__cxx11::
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>::
  _M_move_assign(&(this->m_subpackage).m_replaced_transactions,this_00);
  (this->m_subpackage).m_conflicting_fees = local_278._M_allocated_capacity;
  (this->m_subpackage).m_conflicting_size = local_278._8_8_;
  std::__cxx11::
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::_M_clear(this_00);
  std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)(local_2c8 + 8));
  local_2d8 = (undefined1  [8])
              (this->m_viewmempool).m_non_base_coins._M_h.
              super__Hashtable_base<COutPoint,_COutPoint,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              .
              super__Hash_code_base<COutPoint,_COutPoint,_std::__detail::_Identity,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
              .super__Hashtable_ebo_helper<1,_SaltedOutpointHasher,_false>._M_tp.k0;
  sStack_2d0 = *(uint64_t *)
                ((long)&(this->m_viewmempool).m_non_base_coins._M_h.
                        super__Hashtable_base<COutPoint,_COutPoint,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        .
                        super__Hash_code_base<COutPoint,_COutPoint,_std::__detail::_Identity,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
                        .super__Hashtable_ebo_helper<1,_SaltedOutpointHasher,_false>._M_tp + 8);
  local_118[0] = (_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_2d8;
  local_2c8._0_8_ = 0;
  local_2c8._8_8_ = (this->m_viewmempool).m_non_base_coins._M_h._M_bucket_count;
  auStack_2b8 = (undefined1  [8])0x0;
  local_2b0 = (_Base_ptr)(this->m_viewmempool).m_non_base_coins._M_h._M_element_count;
  _Stack_2a8._M_p = *(pointer *)&(this->m_viewmempool).m_non_base_coins._M_h._M_rehash_policy;
  local_2a0 = (__node_base *)
              (this->m_viewmempool).m_non_base_coins._M_h._M_rehash_policy._M_next_resize;
  auStack_298._0_8_ = 0;
  std::
  _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<COutPoint,false>>>>
            (local_118[0],&(this->m_viewmempool).m_non_base_coins._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<COutPoint,_false>_>_> *)local_118)
  ;
  if (auStack_2b8 != (undefined1  [8])0x0) {
    auVar2 = auStack_2b8;
    do {
      CCoinsViewCache::Uncache(&this->m_view,(COutPoint *)((long)auVar2 + 8));
      auVar2 = (undefined1  [8])((_Hash_node_base *)auVar2)->_M_nxt;
    } while (auVar2 != (undefined1  [8])0x0);
  }
  std::
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2d8);
  CCoinsViewMemPool::Reset(&this->m_viewmempool);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

PackageMempoolAcceptResult MemPoolAccept::AcceptSubPackage(const std::vector<CTransactionRef>& subpackage, ATMPArgs& args)
{
    AssertLockHeld(::cs_main);
    AssertLockHeld(m_pool.cs);
    auto result = [&]() EXCLUSIVE_LOCKS_REQUIRED(::cs_main, m_pool.cs) {
        if (subpackage.size() > 1) {
            return AcceptMultipleTransactions(subpackage, args);
        }
        const auto& tx = subpackage.front();
        ATMPArgs single_args = ATMPArgs::SingleInPackageAccept(args);
        const auto single_res = AcceptSingleTransaction(tx, single_args);
        PackageValidationState package_state_wrapped;
        if (single_res.m_result_type != MempoolAcceptResult::ResultType::VALID) {
            package_state_wrapped.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
        }
        return PackageMempoolAcceptResult(package_state_wrapped, {{tx->GetWitnessHash(), single_res}});
    }